

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbet.c
# Opt level: O0

double hcephes_pseries(double a,double b,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ai;
  double z;
  double t1;
  double n;
  double v;
  double u;
  double t;
  double s;
  double x_local;
  double b_local;
  double a_local;
  
  u = (1.0 - b) * x;
  dVar1 = u / (a + 1.0);
  t1 = 2.0;
  t = 0.0;
  n = dVar1;
  while ((1.0 / a) * 1.1102230246251565e-16 < ABS(n)) {
    u = (((t1 - b) * x) / t1) * u;
    n = u / (a + t1);
    t = n + t;
    t1 = t1 + 1.0;
  }
  dVar1 = 1.0 / a + dVar1 + t;
  dVar2 = log(x);
  if ((171.6243769563027 <= a + b) || (709.782712893384 <= ABS(a * dVar2))) {
    dVar3 = hcephes_lgam(a + b);
    dVar4 = hcephes_lgam(a);
    dVar5 = hcephes_lgam(b);
    dVar1 = log(dVar1);
    dVar1 = ((dVar3 - dVar4) - dVar5) + a * dVar2 + dVar1;
    if (-745.1332191019412 <= dVar1) {
      t = exp(dVar1);
    }
    else {
      t = 0.0;
    }
  }
  else {
    dVar2 = hcephes_gamma(a + b);
    dVar3 = hcephes_gamma(a);
    dVar4 = hcephes_gamma(b);
    dVar5 = pow(x,a);
    t = dVar1 * (dVar2 / (dVar3 * dVar4)) * dVar5;
  }
  return t;
}

Assistant:

static double hcephes_pseries(double a, double b, double x) {
    double s, t, u, v, n, t1, z, ai;

    ai = 1.0 / a;
    u = (1.0 - b) * x;
    v = u / (a + 1.0);
    t1 = v;
    t = u;
    n = 2.0;
    s = 0.0;
    z = HCEPHES_MACHEP * ai;
    while (fabs(v) > z) {
        u = (n - b) * x / n;
        t *= u;
        v = t / (a + n);
        s += v;
        n += 1.0;
    }
    s += t1;
    s += ai;

    u = a * log(x);
    if ((a + b) < MAXGAM && fabs(u) < HCEPHES_MAXLOG) {
        t = hcephes_gamma(a + b) / (hcephes_gamma(a) * hcephes_gamma(b));
        s = s * t * pow(x, a);
    } else {
        t = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b) + u + log(s);
        if (t < HCEPHES_MINLOG)
            s = 0.0;
        else
            s = exp(t);
    }
    return (s);
}